

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QWidget_*> operator-(QSet<QWidget_*> *lhs,QSet<QWidget_*> *rhs)

{
  long lVar1;
  QSet<QWidget_*> *in_RDX;
  Hash in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSet<QWidget_*>::QSet(in_RDX,(QSet<QWidget_*> *)in_RDI.d);
  QSet<QWidget_*>::operator-=(in_RDX,(QSet<QWidget_*> *)in_RDI.d);
  QSet<QWidget_*>::QSet(in_RDX,(QSet<QWidget_*> *)in_RDI.d);
  QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x601c95);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSet<QWidget_*>)(Hash)in_RDI.d;
  }
  __stack_chk_fail();
}

Assistant:

friend QSet operator-(const QSet &lhs, const QSet &rhs) { return QSet(lhs) -= rhs; }